

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_sign.c
# Opt level: O0

int gost_ec_keygen(EC_KEY *ec)

{
  bool bVar1;
  int iVar2;
  BIGNUM *order_00;
  BIGNUM *rnd;
  EC_KEY *in_RDI;
  int ok;
  EC_GROUP *group;
  BIGNUM *d;
  BIGNUM *order;
  char *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined8 local_38;
  undefined4 local_4;
  
  if (in_RDI == (EC_KEY *)0x0) {
    local_38 = (EC_GROUP *)0x0;
  }
  else {
    local_38 = EC_KEY_get0_group(in_RDI);
  }
  bVar1 = false;
  if (local_38 == (EC_GROUP *)0x0) {
    ERR_GOST_error(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
    local_4 = 0;
  }
  else {
    order_00 = BN_new();
    rnd = (BIGNUM *)BN_secure_new();
    if ((order_00 == (BIGNUM *)0x0) || (rnd == (BIGNUM *)0x0)) {
      ERR_GOST_error(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0
                    );
    }
    else {
      iVar2 = EC_GROUP_get_order(local_38,order_00,(BN_CTX *)0x0);
      if (iVar2 == 0) {
        ERR_GOST_error(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                       ,0);
      }
      else {
        do {
          iVar2 = BN_rand_range(rnd,order_00);
          if (iVar2 == 0) {
            ERR_GOST_error(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                           in_stack_ffffffffffffffb8,0);
            goto LAB_001062b5;
          }
          iVar2 = BN_is_zero(rnd);
        } while (iVar2 != 0);
        iVar2 = EC_KEY_set_private_key(in_RDI,rnd);
        if (iVar2 == 0) {
          ERR_GOST_error(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                         in_stack_ffffffffffffffb8,0);
        }
        else {
          bVar1 = true;
        }
      }
    }
LAB_001062b5:
    if (rnd != (BIGNUM *)0x0) {
      BN_free(rnd);
    }
    if (order_00 != (BIGNUM *)0x0) {
      BN_free(order_00);
    }
    if (bVar1) {
      local_4 = gost_ec_compute_public((EC_KEY *)order_00);
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int gost_ec_keygen(EC_KEY *ec)
{
    BIGNUM *order = NULL, *d = NULL;
    const EC_GROUP *group = (ec) ? EC_KEY_get0_group(ec) : NULL;
    int ok = 0;

    if (!group) {
        GOSTerr(GOST_F_GOST_EC_KEYGEN, ERR_R_INTERNAL_ERROR);
        return 0;
    }

    order = BN_new();
    d = BN_secure_new();
    if (!order || !d) {
        GOSTerr(GOST_F_GOST_EC_KEYGEN, ERR_R_MALLOC_FAILURE);
        goto end;
    }

    if (!EC_GROUP_get_order(group, order, NULL)) {
        GOSTerr(GOST_F_GOST_EC_KEYGEN, ERR_R_INTERNAL_ERROR);
        goto end;
    }

    do {
        if (!BN_rand_range(d, order)) {
            GOSTerr(GOST_F_GOST_EC_KEYGEN, GOST_R_RNG_ERROR);
            goto end;
        }
    }
    while (BN_is_zero(d));

    if (!EC_KEY_set_private_key(ec, d)) {
        GOSTerr(GOST_F_GOST_EC_KEYGEN, ERR_R_INTERNAL_ERROR);
        goto end;
    }

    ok = 1;
 end:
    if (d)
        BN_free(d);
    if (order)
        BN_free(order);

    return (ok) ? gost_ec_compute_public(ec) : 0;
}